

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Guild.cpp
# Opt level: O3

void Handlers::Guild_Report(Character *character,PacketReader *reader)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  World *pWVar3;
  GuildManager *pGVar4;
  __node_base_ptr p_Var5;
  long *plVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  string *str;
  _Alloc_hider __s;
  size_type sVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  mapped_type *pmVar12;
  _Node *p_Var13;
  tm *__tp;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  pointer pcVar14;
  _List_node_base *p_Var15;
  long *plVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  long lVar17;
  PacketBuilder reply;
  string rank;
  string create_date;
  string bank_str;
  list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_> recruiters;
  list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_> leaders;
  string tag;
  undefined1 local_168 [56];
  key_type local_130;
  key_type local_110;
  World *local_f0;
  int iStack_e4;
  string local_e0;
  _List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
  local_c0;
  _List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
  local_a8;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  PacketReader::GetInt(reader);
  PacketReader::GetEndString_abi_cxx11_(&local_90,reader);
  sVar8 = local_90._M_string_length;
  pWVar3 = character->world;
  local_168._0_8_ = local_168 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"GuildMaxNameLength","");
  pmVar12 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar3->config,(key_type *)local_168);
  iVar10 = util::variant::GetInt(pmVar12);
  if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
    operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
  }
  if (((ulong)(long)iVar10 < sVar8) || (character->npc_type != Guild)) goto LAB_001a953d;
  if ((local_90._M_string_length & 0xfffffffffffffffe) == 2) {
    pGVar4 = character->world->guildmanager;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_90._M_dataplus._M_p,
               local_90._M_dataplus._M_p + local_90._M_string_length);
    GuildManager::GetGuild((GuildManager *)local_168,(string *)pGVar4);
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_;
    pcVar14 = (pointer)local_168._0_8_;
    local_168._0_8_ = (pointer)0x0;
    local_168._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_60[0] = local_40[0];
    plVar16 = local_50[0];
    if (local_50[0] != local_40) {
LAB_001a8d7d:
      local_168._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_168._0_8_ = (pointer)0x0;
      operator_delete(plVar16,local_60[0] + 1);
    }
  }
  else {
    pGVar4 = character->world->guildmanager;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,local_90._M_dataplus._M_p,
               local_90._M_dataplus._M_p + local_90._M_string_length);
    GuildManager::GetGuildName((GuildManager *)local_168,(string *)pGVar4);
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_;
    pcVar14 = (pointer)local_168._0_8_;
    local_168._0_8_ = (pointer)0x0;
    local_168._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    plVar16 = local_70[0];
    if (local_70[0] != local_60) goto LAB_001a8d7d;
  }
  if (pcVar14 == (pointer)0x0) {
    PacketBuilder::PacketBuilder((PacketBuilder *)local_168,PACKET_GUILD,PACKET_REPLY,2);
    PacketBuilder::AddShort((PacketBuilder *)local_168,0x11);
    Character::Send(character,(PacketBuilder *)local_168);
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_168);
  }
  else {
    pWVar3 = character->world;
    local_168._0_8_ = local_168 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"GuildEditRank","");
    pmVar12 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar3->config,(key_type *)local_168);
    iVar11 = util::variant::GetInt(pmVar12);
    pWVar3 = character->world;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    pcVar1 = local_168 + 0x10;
    local_f0 = (World *)character;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"GuildKickRank","");
    pmVar12 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar3->config,&local_110);
    iVar10 = util::variant::GetInt(pmVar12);
    pWVar3 = local_f0;
    if (iVar10 < iVar11) {
      iVar10 = iVar11;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,
                      CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                               local_110.field_2._M_local_buf[0]) + 1);
    }
    if ((pointer)local_168._0_8_ != pcVar1) {
      operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
    }
    p_Var5 = (pWVar3->home_config).
             super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ._M_h._M_single_bucket;
    local_168._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"GuildRecruitRank","");
    pmVar12 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)(p_Var5 + 0x33),(key_type *)local_168);
    iStack_e4 = util::variant::GetInt(pmVar12);
    if ((pointer)local_168._0_8_ != pcVar1) {
      operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
    }
    local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
    local_a8._M_impl._M_node._M_size = 0;
    local_c0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_c0;
    local_c0._M_impl._M_node._M_size = 0;
    plVar16 = *(long **)(pcVar14 + 0x58);
    plVar6 = *(long **)(pcVar14 + 0x60);
    local_c0._M_impl._M_node.super__List_node_base._M_prev =
         local_c0._M_impl._M_node.super__List_node_base._M_next;
    local_a8._M_impl._M_node.super__List_node_base._M_prev =
         local_a8._M_impl._M_node.super__List_node_base._M_next;
    if (plVar16 != plVar6) {
      do {
        local_168._0_8_ = *plVar16;
        local_168._8_8_ = plVar16[1];
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_)->_M_use_count + 1
            ;
          }
        }
        if (*(int *)(local_168._0_8_ + 0x20) <= iVar10) {
          p_Var13 = std::__cxx11::
                    list<std::shared_ptr<Guild_Member>,std::allocator<std::shared_ptr<Guild_Member>>>
                    ::_M_create_node<std::shared_ptr<Guild_Member>const&>
                              ((list<std::shared_ptr<Guild_Member>,std::allocator<std::shared_ptr<Guild_Member>>>
                                *)&local_a8,(shared_ptr<Guild_Member> *)local_168);
          std::__detail::_List_node_base::_M_hook(&p_Var13->super__List_node_base);
          local_a8._M_impl._M_node._M_size = local_a8._M_impl._M_node._M_size + 1;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
        }
        plVar16 = plVar16 + 2;
      } while (plVar16 != plVar6);
    }
    p_Var5 = (local_f0->home_config).
             super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ._M_h._M_single_bucket;
    local_168._0_8_ = local_168 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"GuildShowRecruiters","");
    pmVar12 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)(p_Var5 + 0x33),(key_type *)local_168);
    bVar9 = util::variant::GetBool(pmVar12);
    if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
      operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
    }
    if (bVar9) {
      plVar16 = *(long **)(pcVar14 + 0x58);
      plVar6 = *(long **)(pcVar14 + 0x60);
      if (plVar16 != plVar6) {
        do {
          local_168._0_8_ = *plVar16;
          local_168._8_8_ = plVar16[1];
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_)->_M_use_count +
                   1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_)->_M_use_count +
                   1;
            }
          }
          if ((iVar10 < *(int *)(local_168._0_8_ + 0x20)) &&
             (*(int *)(local_168._0_8_ + 0x20) <= iStack_e4)) {
            p_Var13 = std::__cxx11::
                      list<std::shared_ptr<Guild_Member>,std::allocator<std::shared_ptr<Guild_Member>>>
                      ::_M_create_node<std::shared_ptr<Guild_Member>const&>
                                ((list<std::shared_ptr<Guild_Member>,std::allocator<std::shared_ptr<Guild_Member>>>
                                  *)&local_c0,(shared_ptr<Guild_Member> *)local_168);
            std::__detail::_List_node_base::_M_hook(&p_Var13->super__List_node_base);
            local_c0._M_impl._M_node._M_size = local_c0._M_impl._M_node._M_size + 1;
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
          }
          plVar16 = plVar16 + 2;
        } while (plVar16 != plVar6);
      }
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    local_110._M_string_length = 0;
    local_110.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::resize((ulong)&local_110,'\x1f');
    __tp = localtime((time_t *)(pcVar14 + 400));
    __s._M_p = local_110._M_dataplus._M_p;
    p_Var5 = (local_f0->home_config).
             super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ._M_h._M_single_bucket;
    paVar2 = &local_130.field_2;
    local_130._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"GuildDateFormat","");
    pmVar12 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)(p_Var5 + 0x33),&local_130);
    util::variant::GetString_abi_cxx11_(&local_e0,pmVar12);
    strftime(__s._M_p,0x1f,local_e0._M_dataplus._M_p,__tp);
    std::__cxx11::string::substr((ulong)local_168,(ulong)&local_110);
    std::__cxx11::string::operator=((string *)&local_110,(string *)local_168);
    iVar10 = extraout_EDX;
    if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
      operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
      iVar10 = extraout_EDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      iVar10 = extraout_EDX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      iVar10 = extraout_EDX_02;
    }
    util::to_string_abi_cxx11_(&local_e0,(util *)(ulong)*(uint *)(pcVar14 + 0x1b8),iVar10);
    PacketBuilder::PacketBuilder
              ((PacketBuilder *)local_168,PACKET_GUILD,PACKET_REPORT,
               (local_c0._M_impl._M_node._M_size + local_a8._M_impl._M_node._M_size) * 0xf +
               *(long *)(pcVar14 + 0x40) + local_110._M_string_length + *(long *)(pcVar14 + 0x1a0) +
               local_e0._M_string_length + 0x15);
    PacketBuilder::AddBreakString((PacketBuilder *)local_168,(string *)(pcVar14 + 0x38),0xff);
    PacketBuilder::AddBreakString((PacketBuilder *)local_168,(string *)(pcVar14 + 0x18),0xff);
    PacketBuilder::AddBreakString((PacketBuilder *)local_168,&local_110,0xff);
    PacketBuilder::AddBreakString((PacketBuilder *)local_168,(string *)(pcVar14 + 0x198),0xff);
    PacketBuilder::AddBreakString((PacketBuilder *)local_168,&local_e0,0xff);
    lVar17 = 0;
    do {
      local_130._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,*(long *)(pcVar14 + lVar17 * 0x20 + 0x70),
                 *(long *)(pcVar14 + lVar17 * 0x20 + 0x78) +
                 *(long *)(pcVar14 + lVar17 * 0x20 + 0x70));
      while (local_130._M_string_length < (__buckets_ptr)0x4) {
        std::__cxx11::string::push_back((char)&local_130);
      }
      PacketBuilder::AddBreakString((PacketBuilder *)local_168,&local_130,0xff);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 9);
    PacketBuilder::AddShort
              ((PacketBuilder *)local_168,
               (short)local_c0._M_impl._M_node._M_size + (short)local_a8._M_impl._M_node._M_size);
    PacketBuilder::AddByte((PacketBuilder *)local_168,0xff);
    if (local_a8._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_a8) {
      p_Var15 = local_a8._M_impl._M_node.super__List_node_base._M_next;
      do {
        plVar16 = *(long **)(p_Var15 + 1);
        p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(p_Var15 + 1) + 8);
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          }
        }
        PacketBuilder::AddChar((PacketBuilder *)local_168,'\x01');
        PacketBuilder::AddByte((PacketBuilder *)local_168,0xff);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        lVar17 = *plVar16;
        std::__cxx11::string::_M_construct<char*>((string *)&local_130,lVar17,plVar16[1] + lVar17);
        std::__cxx11::string::append((char *)&local_130);
        PacketBuilder::AddBreakString((PacketBuilder *)local_168,&local_130,0xff);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
        }
        p_Var15 = (((_List_impl *)&p_Var15->_M_next)->_M_node).super__List_node_base._M_next;
      } while (p_Var15 != (_List_node_base *)&local_a8);
    }
    if (local_c0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_c0) {
      p_Var15 = local_c0._M_impl._M_node.super__List_node_base._M_next;
      do {
        str = *(string **)(p_Var15 + 1);
        p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(p_Var15 + 1) + 8);
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          }
        }
        PacketBuilder::AddChar((PacketBuilder *)local_168,'\x02');
        PacketBuilder::AddByte((PacketBuilder *)local_168,0xff);
        PacketBuilder::AddBreakString((PacketBuilder *)local_168,str,0xff);
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
        }
        p_Var15 = (((_List_impl *)&p_Var15->_M_next)->_M_node).super__List_node_base._M_next;
      } while (p_Var15 != (_List_node_base *)&local_c0);
    }
    Character::Send((Character *)local_f0,(PacketBuilder *)local_168);
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,
                      CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                               local_110.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::
    _List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>::
    _M_clear(&local_c0);
    std::__cxx11::
    _List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>::
    _M_clear(&local_a8);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
LAB_001a953d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Guild_Report(Character *character, PacketReader &reader)
{
	/*int session =*/ reader.GetInt();
	std::string tag = reader.GetEndString();

	if (tag.length() > std::size_t(int(character->world->config["GuildMaxNameLength"])))
	{
		return;
	}

	if (character->npc_type == ENF::Guild)
	{
		std::shared_ptr<Guild> guild;

		if (tag.length() == 2 || tag.length() == 3)
		{
			guild = character->world->guildmanager->GetGuild(tag);
		}
		else
		{
			guild = character->world->guildmanager->GetGuildName(tag);
		}

		if (!guild)
		{
			PacketBuilder reply(PACKET_GUILD, PACKET_REPLY, 2);
			reply.AddShort(GUILD_NOT_FOUND);
			character->Send(reply);
		}
		else
		{
			int leader_rank = std::max(static_cast<int>(character->world->config["GuildEditRank"]), static_cast<int>(character->world->config["GuildKickRank"]));
			int recruiter_rank = character->world->config["GuildRecruitRank"];

			std::list<std::shared_ptr<Guild_Member>> leaders;
			std::list<std::shared_ptr<Guild_Member>> recruiters;

			UTIL_FOREACH(guild->members, member)
			{
				if (member->rank <= leader_rank)
				{
					leaders.push_back(member);
				}
			}

			if (character->world->config["GuildShowRecruiters"])
			{
				UTIL_FOREACH(guild->members, member)
				{
					if (member->rank > leader_rank && member->rank <= recruiter_rank)
					{
						recruiters.push_back(member);
					}
				}
			}

			std::string create_date;
			create_date.resize(31);

			tm *local_time = localtime(&guild->created);
			create_date = create_date.substr(0, strftime(&create_date[0], 31, static_cast<std::string>(character->world->config["GuildDateFormat"]).c_str(), local_time));

			std::string bank_str = util::to_string(guild->bank);

			PacketBuilder reply(PACKET_GUILD, PACKET_REPORT,
				21 + guild->name.length() + create_date.length() + guild->description.length() + bank_str.length()
				+ leaders.size() * 15 + recruiters.size() * 15);

			reply.AddBreakString(guild->name);
			reply.AddBreakString(guild->tag);
			reply.AddBreakString(create_date);
			reply.AddBreakString(guild->description);
			reply.AddBreakString(bank_str);

			for (std::size_t i = 0; i < guild->ranks.size(); ++i)
			{
				std::string rank = guild->ranks[i];

				while (rank.length() < 4)
				{
					rank += ' ';
				}

				reply.AddBreakString(rank);
			}

			reply.AddShort(leaders.size() + recruiters.size());
			reply.AddByte(255);

			UTIL_FOREACH(leaders, member)
			{
				reply.AddChar(1);
				reply.AddByte(255);
				reply.AddBreakString(member->name + (member->rank == 0 ? " (founder)" : ""));
			}

			UTIL_FOREACH(recruiters, member)
			{
				reply.AddChar(2);
				reply.AddByte(255);
				reply.AddBreakString(member->name);
			}

			character->Send(reply);
		}
	}
}